

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_to_string.h
# Opt level: O2

string * cute::cute_to_string::backslashQuoteTabNewline
                   (string *__return_storage_ptr__,string *input)

{
  char cVar1;
  size_type i;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (uVar2 = 0; uVar2 < input->_M_string_length; uVar2 = uVar2 + 1) {
    cVar1 = (input->_M_dataplus)._M_p[uVar2];
    if ((((cVar1 == '\t') || (cVar1 == '\\')) || (cVar1 == '\r')) || (cVar1 == '\n')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string backslashQuoteTabNewline(std::string const &input){
			std::string result;
			result.reserve(input.size());
			for (std::string::size_type i=0; i < input.length() ; ++i){
				switch(input[i]) {
					case '\n': result += "\\n"; break;
					case '\t': result += "\\t"; break;
					case '\\': result += "\\\\"; break;
					case '\r': result += "\\r"; break;
					default: result += input[i];
				}
			}
			return result;
		}